

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O0

bool tchecker::ta::has_guarded_weakly_synchronized_event(system_t *system)

{
  pointer this;
  bool bVar1;
  process_id_t pid;
  event_id_t event_id;
  edge_id_t id;
  system_t *system_00;
  edges_collection_const_iterator_t *peVar2;
  element_type *peVar3;
  typed_expression_t *ptVar4;
  shared_ptr<const_tchecker::system::edge_t> local_80;
  __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_70;
  edge_const_shared_ptr_t *edge;
  edges_collection_const_iterator_t __end2;
  edges_collection_const_iterator_t __begin2;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  local_48;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  *local_38;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  *__range2;
  process_events_map_t weakly_sync_map;
  system_t *system_local;
  
  weakly_sync_map._map.
  super__Vector_base<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)system;
  system_00 = syncprod::system_t::as_system_system(&system->super_system_t);
  tchecker::system::weakly_synchronized_events((process_events_map_t *)&__range2,system_00);
  local_48 = tchecker::system::edges_t::edges
                       ((edges_t *)
                        &weakly_sync_map._map.
                         super__Vector_base<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage[7].
                         super_flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
                         .m_data.m_seq.m_holder.m_capacity);
  local_38 = &local_48;
  peVar2 = range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
           ::begin(local_38);
  __end2.super_const_iterator._M_current = (const_iterator)(peVar2->super_const_iterator)._M_current
  ;
  peVar2 = range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
           ::end(local_38);
  edge = (edge_const_shared_ptr_t *)(peVar2->super_const_iterator)._M_current;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2.super_const_iterator,
                       (__normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
                        *)&edge);
    if (!bVar1) break;
    tchecker::system::edges_collection_const_iterator_t::operator*
              ((edges_collection_const_iterator_t *)&local_80);
    local_70 = (__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&local_80;
    peVar3 = std::
             __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_70);
    pid = tchecker::system::edge_t::pid(peVar3);
    peVar3 = std::
             __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_70);
    event_id = tchecker::system::edge_t::event_id(peVar3);
    bVar1 = tchecker::system::process_events_map_t::contains
                      ((process_events_map_t *)&__range2,pid,event_id);
    this = weakly_sync_map._map.
           super__Vector_base<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_70);
      id = tchecker::system::edge_t::id(peVar3);
      ptVar4 = system_t::guard((system_t *)this,id);
      const_evaluate((expression_t *)(&ptVar4->field_0x0 + *(long *)(*(long *)ptVar4 + -0x38)));
    }
    std::shared_ptr<const_tchecker::system::edge_t>::~shared_ptr(&local_80);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
    ::operator++(&__end2.super_const_iterator);
  }
  tchecker::system::process_events_map_t::~process_events_map_t((process_events_map_t *)&__range2);
  return false;
}

Assistant:

bool has_guarded_weakly_synchronized_event(tchecker::ta::system_t const & system)
{
  tchecker::system::process_events_map_t weakly_sync_map =
      tchecker::system::weakly_synchronized_events(system.as_system_system());

  for (tchecker::system::edge_const_shared_ptr_t const & edge : system.edges()) {
    if (weakly_sync_map.contains(edge->pid(), edge->event_id())) {
      try {
        tchecker::const_evaluate(system.guard(edge->id()));
      }
      catch (...) {
        return true;
      }
    }
  }
  return false;
}